

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

void __thiscall semver::version<long,_long,_long>::clear(version<long,_long,_long> *this)

{
  version<long,_long,_long> *this_local;
  
  this->major_ = 0;
  this->minor_ = 1;
  this->patch_ = 0;
  Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  clear((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->prerelease_tag_)
  ;
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::clear(&this->prerelease_identifiers);
  Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  clear((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->build_metadata_)
  ;
  return;
}

Assistant:

SEMVER_CONSTEXPR void clear() noexcept {
      major_ = 0;
      minor_ = 1;
      patch_ = 0;

      prerelease_tag_.clear();
      prerelease_identifiers.clear();
      build_metadata_.clear();
    }